

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void pbrt::parse(SceneRepresentation *scene,
                unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *t)

{
  undefined1 *puVar1;
  memory_resource *pmVar2;
  FileLoc loc;
  SceneRepresentation *pSVar3;
  ParsedParameter **__s1;
  int iVar4;
  long lVar5;
  _func_optional<pbrt::Token>__Any_data_ptr_int_ptr *__tmp;
  size_type __rlen_5;
  offset_in_SceneRepresentation_to_subr apiFunc;
  memory_resource mVar6;
  char *t_00;
  memory_resource *pmVar7;
  Allocator alloc_00;
  size_type __rlen;
  long *plVar8;
  double dVar9;
  string_view sVar10;
  bool formatting;
  ParsedParameterVector params;
  CheckCallbackScope _;
  Token t_1;
  optional<pbrt::Token> tok;
  anon_class_1_0_00000001 parseError;
  string name;
  string texName;
  string type;
  anon_class_8_1_6da50f9a unget;
  Allocator alloc;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  fileStack;
  anon_class_48_6_0442aee5 basicParamListEntrypoint;
  optional<pbrt::Token> ungetToken;
  TrackedMemoryResource memoryResource;
  int in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined8 uStack_338;
  bool local_329;
  undefined1 local_328 [16];
  undefined1 auStack_318 [16];
  long local_308 [6];
  size_t local_2d8;
  size_t local_2d0;
  CheckCallbackScope local_2c1;
  SceneRepresentation *local_2c0;
  undefined1 local_2b8 [40];
  char local_290;
  memory_resource *local_288;
  ParsedParameter **ppPStack_280;
  undefined1 auStack_278 [24];
  char local_260;
  anon_class_1_0_00000001 local_249;
  undefined1 local_248 [32];
  undefined1 local_228 [16];
  memory_resource local_218 [2];
  undefined8 local_208 [2];
  _Invoker_type local_1f8 [2];
  size_type *local_1e8 [2];
  size_type local_1d8 [2];
  anon_class_8_1_6da50f9a local_1c8;
  Allocator local_1c0;
  anon_class_1_0_00000001 *local_1b8;
  _Alloc_hider _Stack_1b0;
  code *pcStack_1a8;
  code *pcStack_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  local_178;
  _Any_data local_158;
  code *pcStack_148;
  code *pcStack_140;
  anon_class_48_6_0442aee5 local_130;
  _Any_data local_100;
  code *local_f0;
  optional<pbrt::Token> local_e0;
  undefined1 local_b0 [112];
  long local_40;
  undefined8 local_38;
  
  local_2c0 = scene;
  if (scene == (SceneRepresentation *)0x0) {
    local_329 = false;
  }
  else {
    lVar5 = __dynamic_cast(scene,&SceneRepresentation::typeinfo,&FormattingScene::typeinfo,0);
    local_329 = lVar5 != 0;
  }
  local_b0._8_8_ = pstd::pmr::get_default_resource();
  local_1c0.memoryResource = (memory_resource *)local_b0;
  local_b0._0_8_ = &PTR__memory_resource_02fa4988;
  local_b0._16_8_ = 0;
  local_b0._24_8_ = 0;
  local_178.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
  ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
            ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
              *)&local_178,t);
  local_e0.set = false;
  local_248._0_8_ = 0;
  local_248._8_8_ = (char *)0x0;
  local_248._16_8_ = (ParsedParameter *)0x0;
  local_248._24_8_ = (ParsedParameter *)0x0;
  local_328._0_8_ = (memory_resource *)0x0;
  local_328._8_8_ = (ParsedParameter **)0x0;
  auStack_318._0_8_ = (ParsedParameter *)0x0;
  auStack_318._8_8_ = (ParsedParameter *)0x0;
  local_248._0_8_ = operator_new(0x28);
  auStack_318._0_8_ = local_248._16_8_;
  local_1c8.ungetToken = &local_e0;
  *(optional<pbrt::Token> **)local_248._0_8_ = local_1c8.ungetToken;
  *(vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
    **)(local_248._0_8_ + 8) =
       (vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
        *)&local_178;
  local_130.nextToken = (function<pstd::optional<pbrt::Token>_(int)> *)local_248;
  *(function<pstd::optional<pbrt::Token>_(int)> **)(local_248._0_8_ + 0x10) = local_130.nextToken;
  local_130.formatting = &local_329;
  *(bool **)(local_248._0_8_ + 0x18) = local_130.formatting;
  local_130.scene = &local_2c0;
  *(SceneRepresentation ***)(local_248._0_8_ + 0x20) = local_130.scene;
  local_248._8_8_ = local_328._8_8_;
  local_328._0_8_ = (memory_resource *)0x0;
  local_328._8_8_ = (ParsedParameter **)0x0;
  local_248._16_8_ =
       std::
       _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
       ::_M_manager;
  auStack_318._8_8_ = local_248._24_8_;
  local_248._24_8_ =
       std::
       _Function_handler<pstd::optional<pbrt::Token>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:550:17)>
       ::_M_invoke;
  if ((ParsedParameter *)auStack_318._0_8_ != (ParsedParameter *)0x0) {
    (*(code *)auStack_318._0_8_)(local_328,local_328,3);
  }
  local_130.unget = &local_1c8;
  local_130.alloc = &local_1c0;
  local_130.parseError = &local_249;
  local_158._M_unused._M_object = &local_288;
  local_260 = '\0';
  local_158._8_8_ = 0;
  pcStack_140 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
                ::_M_invoke;
  pcStack_148 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:609:26)>
                ::_M_manager;
  CheckCallbackScope::CheckCallbackScope
            (&local_2c1,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_158);
  if (pcStack_148 != (code *)0x0) {
    (*pcStack_148)(&local_158,&local_158,__destroy_functor);
  }
  local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
  if ((code *)local_248._16_8_ != (code *)0x0) {
    pmVar2 = (memory_resource *)(local_2b8 + 0x10);
    do {
      (*(code *)local_248._24_8_)(local_328,(Token *)local_248,local_2b8);
      if (local_260 == '\x01') {
        local_260 = '\0';
      }
      if ((undefined1)local_308[1] == '\x01') {
        auStack_278._16_8_ = local_308[0];
        local_288 = (memory_resource *)local_328._0_8_;
        ppPStack_280 = (ParsedParameter **)local_328._8_8_;
        auStack_278._0_8_ = auStack_318._0_8_;
        auStack_278._8_8_ = auStack_318._8_8_;
        local_260 = '\x01';
        local_308[1]._0_1_ = '\0';
      }
      __s1 = ppPStack_280;
      pmVar7 = local_288;
      if ((undefined1)local_308[1] == '\x01') {
        local_308[1]._0_1_ = '\0';
      }
      if (local_260 == '\0') {
        CheckCallbackScope::~CheckCallbackScope(&local_2c1);
        if (local_260 == '\x01') {
          local_260 = '\0';
        }
        if ((code *)local_248._16_8_ != (code *)0x0) {
          (*(code *)local_248._16_8_)(local_248,local_248,3);
        }
        if (local_e0.set == true) {
          local_e0.set = false;
        }
        std::
        vector<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>,_std::allocator<std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>_>_>
        ::~vector(&local_178);
        pstd::pmr::memory_resource::~memory_resource((memory_resource *)local_b0);
        return;
      }
      switch(*(char *)ppPStack_280) {
      case 'A':
        puVar1 = (undefined1 *)((long)&local_288[-2]._vptr_memory_resource + 7);
        switch(puVar1) {
        case (undefined1 *)0x0:
switchD_0022e505_caseD_0:
          iVar4 = bcmp(__s1,"Attribute",(size_t)pmVar7);
          if (iVar4 == 0) {
            apiFunc = 0xe9;
            goto LAB_00230259;
          }
          if (pmVar7 != (memory_resource *)0xb) {
            if (pmVar7 != (memory_resource *)0xf) goto switchD_0022e505_caseD_1;
            goto switchD_0022e505_caseD_6;
          }
          break;
        default:
          goto switchD_0022e505_caseD_1;
        case (undefined1 *)0x2:
          break;
        case (undefined1 *)0x3:
switchD_0022e505_caseD_3:
          iVar4 = bcmp(__s1,"AttributeEnd",(size_t)pmVar7);
          if (iVar4 == 0) {
            lVar5 = 0xe0;
            goto LAB_0022ffe2;
          }
          if (pmVar7 == (memory_resource *)0xf) goto switchD_0022e505_caseD_6;
          if (pmVar7 != (memory_resource *)0xb) {
            if (pmVar7 != (memory_resource *)&DAT_00000009) goto switchD_0022e505_caseD_1;
            goto switchD_0022e505_caseD_0;
          }
          break;
        case (undefined1 *)0x5:
          iVar4 = bcmp(ppPStack_280,"AttributeBegin",(size_t)local_288);
          if (iVar4 == 0) {
            lVar5 = 0xd8;
            goto LAB_0022ffe2;
          }
          switch(puVar1) {
          case (undefined1 *)0x0:
            goto switchD_0022e505_caseD_0;
          default:
            goto switchD_0022e505_caseD_1;
          case (undefined1 *)0x2:
            break;
          case (undefined1 *)0x3:
            goto switchD_0022e505_caseD_3;
          case (undefined1 *)0x6:
            goto switchD_0022e505_caseD_6;
          }
        case (undefined1 *)0x6:
switchD_0022e505_caseD_6:
          iVar4 = bcmp(__s1,"ActiveTransform",(size_t)pmVar7);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            t_00 = (char *)local_248;
            (*(code *)local_248._24_8_)(local_328,(Token *)local_248,local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if ((memory_resource *)local_328._0_8_ == (memory_resource *)&DAT_00000009) {
              t_00 = "StartTime";
              iVar4 = bcmp((void *)local_328._8_8_,"StartTime",9);
              if (iVar4 == 0) {
                lVar5 = 0x78;
LAB_0022fa1a:
                if (local_260 == '\0') goto LAB_00230b4f;
                in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
                in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
                (**(code **)((long)local_2c0->_vptr_SceneRepresentation + lVar5))();
                goto LAB_00230288;
              }
            }
            else if ((memory_resource *)local_328._0_8_ == (memory_resource *)0x7) {
              t_00 = "EndTime";
              iVar4 = bcmp((void *)local_328._8_8_,"EndTime",7);
              if (iVar4 == 0) {
                lVar5 = 0x70;
                goto LAB_0022fa1a;
              }
            }
            else if ((memory_resource *)local_328._0_8_ == (memory_resource *)0x3) {
              t_00 = "All";
              iVar4 = bcmp((void *)local_328._8_8_,"All",3);
              if (iVar4 == 0) {
                lVar5 = 0x68;
                goto LAB_0022fa1a;
              }
            }
            if (local_260 == '\x01') {
              parse::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_288,(Token *)t_00);
            }
LAB_00230b4f:
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
          }
          if (pmVar7 != (memory_resource *)0xb) {
            if ((pmVar7 != (memory_resource *)0xf) ||
               (iVar4 = bcmp(__s1,"AreaLightSource",0xf), iVar4 != 0))
            goto switchD_0022e505_caseD_1;
            apiFunc = 0x129;
            goto LAB_00230259;
          }
        }
        iVar4 = bcmp(__s1,"Accelerator",(size_t)pmVar7);
        apiFunc = 0xa1;
        if (iVar4 != 0) {
switchD_0022e505_caseD_1:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        break;
      default:
        local_328._0_8_ = local_328 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,ppPStack_280,
                   (char *)((long)&local_288->_vptr_memory_resource + (long)ppPStack_280));
        ErrorExit<std::__cxx11::string>
                  ((FileLoc *)auStack_278,"Unknown directive: %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
      case 'C':
        switch(local_288) {
        case (memory_resource *)0x6:
          break;
        default:
          goto switchD_0022edc5_caseD_7;
        case (memory_resource *)0xa:
          goto switchD_0022edc5_caseD_a;
        case (memory_resource *)0xf:
          iVar4 = bcmp(ppPStack_280,"ConcatTransform",(size_t)local_288);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Token *)local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (((memory_resource *)local_328._0_8_ != (memory_resource *)0x1) ||
               (iVar4 = bcmp((void *)local_328._8_8_,"[",1), iVar4 != 0)) {
              if (local_260 != '\0') {
                local_328._0_8_ = local_328 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_328,ppPStack_280,
                           (char *)((long)&local_288->_vptr_memory_resource + (long)ppPStack_280));
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)auStack_278,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
              }
              goto LAB_00230c51;
            }
            lVar5 = 0;
            do {
              local_228._0_4_ = 1;
              if ((code *)local_248._16_8_ == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*(code *)local_248._24_8_)
                        ((Token *)local_2b8,(Token *)local_248,(Tokenizer *)local_228);
              if (local_290 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              dVar9 = parseNumber((Token *)local_2b8);
              *(float *)(local_328 + lVar5 * 4) = (float)dVar9;
              if (local_290 == '\x01') {
                local_290 = '\0';
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x10);
            local_228._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)
                      ((Token *)local_2b8,(Token *)local_248,(Tokenizer *)local_228);
            if (local_290 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (((memory_resource *)local_2b8._0_8_ != (memory_resource *)0x1) ||
               (iVar4 = bcmp((void *)local_2b8._8_8_,"]",1), iVar4 != 0)) {
              if (local_260 != '\0') {
                local_2b8._0_8_ = pmVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,ppPStack_280,
                           (char *)((long)&local_288->_vptr_memory_resource + (long)ppPStack_280));
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)auStack_278,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b8);
              }
LAB_00230be5:
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (local_260 != '\x01') goto LAB_00230be5;
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*local_2c0->_vptr_SceneRepresentation[9])(local_2c0,local_328);
            goto LAB_00230288;
          }
          if (0xf < (long)pmVar7) {
            if (pmVar7 != (memory_resource *)0x11) {
              if (pmVar7 != (memory_resource *)0x10) goto switchD_0022edc5_caseD_7;
              goto switchD_0022edc5_caseD_10;
            }
            goto switchD_0022edc5_caseD_11;
          }
          goto LAB_0022ee4a;
        case (memory_resource *)0x10:
switchD_0022edc5_caseD_10:
          iVar4 = bcmp(__s1,"CoordinateSystem",(size_t)pmVar7);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            sVar10 = dequoteString((Token *)local_328);
            pSVar3 = local_2c0;
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*pSVar3->_vptr_SceneRepresentation[0xb])(pSVar3,local_328);
            goto LAB_0022ef8b;
          }
          if (pmVar7 != (memory_resource *)0x6) {
            if (pmVar7 != (memory_resource *)0xa) {
              if (pmVar7 != (memory_resource *)0x11) goto switchD_0022edc5_caseD_7;
              goto switchD_0022edc5_caseD_11;
            }
            goto switchD_0022edc5_caseD_a;
          }
          break;
        case (memory_resource *)0x11:
switchD_0022edc5_caseD_11:
          iVar4 = bcmp(__s1,"CoordSysTransform",(size_t)pmVar7);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            sVar10 = dequoteString((Token *)local_328);
            pSVar3 = local_2c0;
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*pSVar3->_vptr_SceneRepresentation[0xc])(pSVar3,local_328);
            goto LAB_0022ef8b;
          }
LAB_0022ee4a:
          if (pmVar7 != (memory_resource *)0x6) {
            if (pmVar7 != (memory_resource *)0xa) goto switchD_0022edc5_caseD_7;
switchD_0022edc5_caseD_a:
            iVar4 = bcmp(__s1,"ColorSpace",(size_t)pmVar7);
            if (iVar4 == 0) {
              local_2b8._0_4_ = 1;
              if ((code *)local_248._16_8_ == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
              if ((undefined1)local_308[1] == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              sVar10 = dequoteString((Token *)local_328);
              pSVar3 = local_2c0;
              if ((undefined1)local_308[1] == '\x01') {
                local_308[1]._0_1_ = '\0';
              }
              local_328._0_8_ = local_328 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
              if (local_260 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
              in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
              (*pSVar3->_vptr_SceneRepresentation[0x11])(pSVar3,local_328);
LAB_0022ef8b:
              mVar6._vptr_memory_resource = (_func_int **)auStack_318._0_8_;
              pmVar7 = (memory_resource *)local_328._0_8_;
              if ((memory_resource *)local_328._0_8_ != (memory_resource *)(local_328 + 0x10)) {
LAB_0022f753:
                operator_delete(pmVar7,(ulong)((long)&(((ParsedParameter *)
                                                       mVar6._vptr_memory_resource)->type).
                                                      _M_dataplus._M_p + 1));
              }
              goto LAB_00230288;
            }
            if (pmVar7 != (memory_resource *)0x6) goto switchD_0022edc5_caseD_7;
          }
        }
        iVar4 = bcmp(__s1,"Camera",(size_t)pmVar7);
        apiFunc = 0xb1;
        if (iVar4 != 0) {
switchD_0022edc5_caseD_7:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        break;
      case 'F':
        if (local_288 != (memory_resource *)0x4) {
LAB_002305b0:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        iVar4 = bcmp(ppPStack_280,"Film",4);
        apiFunc = 0x99;
        if (iVar4 != 0) goto LAB_002305b0;
        break;
      case 'I':
        if (local_288 == (memory_resource *)0x7) {
          iVar4 = bcmp(ppPStack_280,"Include",7);
          if (iVar4 != 0) goto LAB_002306c3;
          local_228._0_4_ = 1;
          if ((code *)local_248._16_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
          if ((undefined1)local_308[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
          }
          local_2b8._32_8_ = local_308[0];
          local_2b8._0_8_ = local_328._0_8_;
          local_2b8._8_8_ = local_328._8_8_;
          local_2b8._16_8_ = auStack_318._0_8_;
          local_2b8._24_8_ = auStack_318._8_8_;
          sVar10 = dequoteString((Token *)local_2b8);
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
          if (local_329 == true) {
            lVar5 = __dynamic_cast(local_2c0,&SceneRepresentation::typeinfo,
                                   &FormattingScene::typeinfo,0);
            local_228._0_8_ = local_218;
            std::__cxx11::string::_M_construct((ulong)local_228,(char)*(undefined4 *)(lVar5 + 0xc));
            Printf<std::__cxx11::string,std::__cxx11::string&>
                      ("%sInclude \"%s\"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
            if ((memory_resource *)local_228._0_8_ != local_218) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)local_218[0]._vptr_memory_resource + 1));
            }
          }
          else {
            ResolveFilename((string *)local_228,(string *)local_328);
            std::__cxx11::string::operator=((string *)local_328,(string *)local_228);
            if ((memory_resource *)local_228._0_8_ != local_218) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)local_218[0]._vptr_memory_resource + 1));
            }
            local_198._M_unused._M_object = (void *)0x0;
            local_198._8_8_ = 0;
            local_180 = std::
                        _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                        ::_M_invoke;
            local_188 = std::
                        _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:542:23)>
                        ::_M_manager;
            Tokenizer::CreateFromFile
                      ((Tokenizer *)local_228,(string *)local_328,
                       (function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)&local_198);
            if (local_188 != (code *)0x0) {
              (*local_188)(&local_198,&local_198,__destroy_functor);
            }
            if ((memory_resource *)local_228._0_8_ != (memory_resource *)0x0) {
              std::
              vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
              ::emplace_back<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>
                        ((vector<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>,std::allocator<std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>>>
                          *)&local_178,
                         (unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                         local_228);
            }
            std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
                      ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                       local_228);
          }
          goto LAB_0022ef8b;
        }
        if (local_288 == (memory_resource *)0x8) {
          iVar4 = bcmp(ppPStack_280,"Identity",8);
          lVar5 = 0x28;
          if (iVar4 != 0) goto LAB_002306c3;
          goto LAB_0022ffe2;
        }
        if ((local_288 != (memory_resource *)0xa) ||
           (iVar4 = bcmp(ppPStack_280,"Integrator",10), iVar4 != 0)) {
LAB_002306c3:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        apiFunc = 0xa9;
        break;
      case 'L':
        if (local_288 != (memory_resource *)0x6) {
          if ((local_288 != (memory_resource *)0xb) ||
             (iVar4 = bcmp(ppPStack_280,"LightSource",0xb), iVar4 != 0)) goto LAB_00230655;
          apiFunc = 0x121;
          break;
        }
        iVar4 = bcmp(ppPStack_280,"LookAt",6);
        if (iVar4 != 0) {
LAB_00230655:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        lVar5 = 0;
        do {
          local_228._0_4_ = 1;
          if ((code *)local_248._16_8_ == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
          if ((undefined1)local_308[1] == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
          }
          dVar9 = parseNumber((Token *)local_328);
          *(float *)(local_2b8 + lVar5 * 4) = (float)dVar9;
          if ((undefined1)local_308[1] == '\x01') {
            local_308[1]._0_1_ = '\0';
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 9);
        if (local_260 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        in_stack_fffffffffffffca8 = local_2b8._32_4_;
        (*local_2c0->_vptr_SceneRepresentation[8])
                  (local_2b8._0_8_ & 0xffffffff,(ulong)local_2b8._0_8_ >> 0x20,
                   local_2b8._8_8_ & 0xffffffff,(ulong)local_2b8._8_8_ >> 0x20,
                   local_2b8._16_8_ & 0xffffffff,(ulong)local_2b8._16_8_ >> 0x20,
                   local_2b8._24_8_ & 0xffffffff,(ulong)local_2b8._24_8_ >> 0x20);
        goto LAB_00230288;
      case 'M':
        if (local_288 == (memory_resource *)0x8) {
          iVar4 = bcmp(ppPStack_280,"Material",8);
          if (iVar4 != 0) {
LAB_0023068c:
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,__s1,
                       (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)auStack_278,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
          }
          apiFunc = 0x109;
        }
        else if (local_288 == (memory_resource *)0xf) {
          iVar4 = bcmp(ppPStack_280,"MakeNamedMedium",0xf);
          if (iVar4 != 0) {
            iVar4 = bcmp(__s1,"MediumInterface",0xf);
            if (iVar4 != 0) goto LAB_0023068c;
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Token *)local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            sVar10 = dequoteString((Token *)local_328);
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            lVar5 = 0x10;
            do {
              *(undefined1 **)((long)&uStack_338 + lVar5) = local_328 + lVar5;
              *(undefined8 *)(&stack0xfffffffffffffcd0 + lVar5) = 0;
              local_328[lVar5] = 0;
              lVar5 = lVar5 + 0x20;
            } while (lVar5 != 0x50);
            local_2b8._0_8_ = pmVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,sVar10._M_str,sVar10._M_str + sVar10._M_len);
            std::__cxx11::string::operator=((string *)local_328,(string *)local_2b8);
            if ((memory_resource *)local_2b8._0_8_ != pmVar2) {
              operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
            }
            local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)
                      ((Token *)local_2b8,(Token *)local_248,(Tokenizer *)local_228);
            if (local_290 == '\x01') {
              if ((((ulong)local_2b8._0_8_ < (memory_resource *)0x2) ||
                  (*(char *)local_2b8._8_8_ != '\"')) ||
                 (((char *)(local_2b8._8_8_ + -1))[local_2b8._0_8_] != '\"')) {
                if (*(bool *)((long)local_1c8.ungetToken + 0x28) == true) {
                  LogFatal<char_const(&)[24]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
                             ,0x244,"Check failed: %s",(char (*) [24])"!ungetToken.has_value()");
                }
                *(undefined8 *)((long)local_1c8.ungetToken + 0x20) = local_2b8._32_8_;
                *(undefined8 *)local_1c8.ungetToken = local_2b8._0_8_;
                *(undefined8 *)((long)local_1c8.ungetToken + 8) = local_2b8._8_8_;
                *(undefined8 *)((long)local_1c8.ungetToken + 0x10) = local_2b8._16_8_;
                *(undefined8 *)((long)local_1c8.ungetToken + 0x18) = local_2b8._24_8_;
                *(bool *)((long)local_1c8.ungetToken + 0x28) = true;
                goto LAB_0022f224;
              }
              sVar10 = dequoteString((Token *)local_2b8);
              local_228._0_8_ = local_218;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_228,sVar10._M_str,sVar10._M_str + sVar10._M_len);
              std::__cxx11::string::operator=((string *)local_308,(string *)local_228);
              if ((memory_resource *)local_228._0_8_ != local_218) {
                operator_delete((void *)local_228._0_8_,
                                (ulong)((long)local_218[0]._vptr_memory_resource + 1));
              }
            }
            else {
LAB_0022f224:
              std::__cxx11::string::_M_assign((string *)local_308);
            }
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*local_2c0->_vptr_SceneRepresentation[0x18])(local_2c0,local_328,local_308);
            if (local_290 == '\x01') {
              local_290 = '\0';
            }
            lVar5 = -0x40;
            plVar8 = local_308 + 2;
            do {
              if (plVar8 != (long *)plVar8[-2]) {
                operator_delete((long *)plVar8[-2],*plVar8 + 1);
              }
              plVar8 = plVar8 + -4;
              lVar5 = lVar5 + 0x20;
            } while (lVar5 != 0);
            goto LAB_00230288;
          }
          apiFunc = 0xb9;
        }
        else {
          if ((local_288 != (memory_resource *)0x11) ||
             (iVar4 = bcmp(ppPStack_280,"MakeNamedMaterial",0x11), iVar4 != 0)) goto LAB_0023068c;
          apiFunc = 0x111;
        }
        break;
      case 'N':
        if ((local_288 != (memory_resource *)0xd) ||
           (iVar4 = bcmp(ppPStack_280,"NamedMaterial",0xd), iVar4 != 0)) {
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        local_2b8._0_4_ = 1;
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        sVar10 = dequoteString((Token *)local_328);
        pSVar3 = local_2c0;
        if ((undefined1)local_308[1] == '\x01') {
          local_308[1]._0_1_ = '\0';
        }
        local_328._0_8_ = local_328 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
        if (local_260 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
        in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
        (*pSVar3->_vptr_SceneRepresentation[0x23])(pSVar3,local_328);
        goto LAB_0022ef8b;
      case 'O':
        switch(local_288) {
        case (memory_resource *)0x6:
          break;
        default:
          goto switchD_0022ecd0_caseD_7;
        case (memory_resource *)0x9:
switchD_0022ecd0_caseD_9:
          iVar4 = bcmp(__s1,"ObjectEnd",(size_t)pmVar7);
          if (iVar4 == 0) {
            lVar5 = 0x140;
            goto LAB_0022ffe2;
          }
          if (pmVar7 != (memory_resource *)0x6) {
            if (pmVar7 != (memory_resource *)0xe) goto switchD_0022ecd0_caseD_7;
            goto switchD_0022ecd0_caseD_e;
          }
          break;
        case (memory_resource *)0xb:
          iVar4 = bcmp(ppPStack_280,"ObjectBegin",(size_t)local_288);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            sVar10 = dequoteString((Token *)local_328);
            pSVar3 = local_2c0;
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*pSVar3->_vptr_SceneRepresentation[0x27])(pSVar3,local_328);
            goto LAB_0022ef8b;
          }
          if (pmVar7 != (memory_resource *)0x6) {
            if (pmVar7 != (memory_resource *)0xe) {
              if (pmVar7 != (memory_resource *)&DAT_00000009) goto switchD_0022ecd0_caseD_7;
              goto switchD_0022ecd0_caseD_9;
            }
            goto switchD_0022ecd0_caseD_e;
          }
          break;
        case (memory_resource *)0xe:
switchD_0022ecd0_caseD_e:
          iVar4 = bcmp(__s1,"ObjectInstance",(size_t)pmVar7);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)((Token *)local_328,(Token *)local_248,local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            sVar10 = dequoteString((Token *)local_328);
            pSVar3 = local_2c0;
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,sVar10._M_str,sVar10._M_str + sVar10._M_len);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*pSVar3->_vptr_SceneRepresentation[0x29])(pSVar3,local_328);
            goto LAB_0022ef8b;
          }
          if (pmVar7 != (memory_resource *)0x6) goto switchD_0022ecd0_caseD_7;
        }
        iVar4 = bcmp(__s1,"Option",(size_t)pmVar7);
        if (iVar4 != 0) {
switchD_0022ecd0_caseD_7:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        local_228._0_4_ = 1;
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        sVar10 = dequoteString((Token *)local_328);
        local_2b8._0_8_ = pmVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,sVar10._M_str,sVar10._M_str + sVar10._M_len);
        if ((undefined1)local_308[1] == '\x01') {
          local_308[1]._0_1_ = '\0';
        }
        local_1e8[0] = (size_type *)CONCAT44(local_1e8[0]._4_4_,1);
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)(local_328,(Token *)local_248,local_1e8);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        local_228._0_8_ = local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,local_328._8_8_,(pointer)(local_328._0_8_ + local_328._8_8_))
        ;
        if ((undefined1)local_308[1] == '\x01') {
          local_308[1]._0_1_ = '\0';
        }
        if (local_260 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
        in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
        (*local_2c0->_vptr_SceneRepresentation[4])
                  (local_2c0,(string *)local_2b8,(Tokenizer *)local_228);
        if ((memory_resource *)local_228._0_8_ != local_218) {
          operator_delete((void *)local_228._0_8_,
                          (ulong)((long)local_218[0]._vptr_memory_resource + 1));
        }
        mVar6._vptr_memory_resource = (_func_int **)local_2b8._16_8_;
        pmVar7 = (memory_resource *)local_2b8._0_8_;
        if ((memory_resource *)local_2b8._0_8_ == pmVar2) goto LAB_00230288;
        goto LAB_0022f753;
      case 'P':
        if (local_288 != (memory_resource *)0xb) {
LAB_00230542:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        iVar4 = bcmp(ppPStack_280,"PixelFilter",0xb);
        apiFunc = 0x91;
        if (iVar4 != 0) goto LAB_00230542;
        break;
      case 'R':
        if (local_288 == (memory_resource *)0x6) {
          iVar4 = bcmp(ppPStack_280,"Rotate",6);
          if (iVar4 != 0) {
LAB_0023061e:
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,__s1,
                       (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)auStack_278,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
          }
          lVar5 = 0;
          do {
            local_228._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            dVar9 = parseNumber((Token *)local_328);
            *(float *)(local_2b8 + lVar5 * 4) = (float)dVar9;
            if ((undefined1)local_308[1] == '\x01') {
              local_308[1]._0_1_ = '\0';
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (local_260 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
          }
          in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
          in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
          (*local_2c0->_vptr_SceneRepresentation[7])
                    (local_2b8._0_8_ & 0xffffffff,(ulong)local_2b8._0_8_ >> 0x20,
                     local_2b8._8_8_ & 0xffffffff,(ulong)local_2b8._8_8_ >> 0x20);
        }
        else {
          if ((local_288 != (memory_resource *)0x12) ||
             (iVar4 = bcmp(ppPStack_280,"ReverseOrientation",0x12), iVar4 != 0)) goto LAB_0023061e;
          lVar5 = 0x130;
LAB_0022ffe2:
          in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
          in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
          (**(code **)((long)local_2c0->_vptr_SceneRepresentation + lVar5))();
        }
        goto LAB_00230288;
      case 'S':
        if (local_288 == (memory_resource *)0x7) {
          iVar4 = bcmp(ppPStack_280,"Sampler",7);
          if (iVar4 != 0) goto LAB_002305e7;
          apiFunc = 0xc9;
        }
        else {
          if (local_288 != (memory_resource *)&DAT_00000005) {
LAB_002305e7:
            local_328._0_8_ = local_328 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,__s1,
                       (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
            ErrorExit<std::__cxx11::string>
                      ((FileLoc *)auStack_278,"Unknown directive: %s",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
          }
          iVar4 = bcmp(ppPStack_280,"Shape",5);
          if (iVar4 != 0) {
            iVar4 = bcmp(__s1,"Scale",5);
            if (iVar4 != 0) goto LAB_002305e7;
            lVar5 = 0;
            do {
              local_228._0_4_ = 1;
              if ((code *)local_248._16_8_ == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
              if ((undefined1)local_308[1] == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              dVar9 = parseNumber((Token *)local_328);
              *(float *)(local_2b8 + lVar5 * 4) = (float)dVar9;
              if ((undefined1)local_308[1] == '\x01') {
                local_308[1]._0_1_ = '\0';
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (**local_2c0->_vptr_SceneRepresentation)
                      (local_2b8._0_8_ & 0xffffffff,(ulong)local_2b8._0_8_ >> 0x20,
                       local_2b8._8_8_ & 0xffffffff);
            goto LAB_00230288;
          }
          apiFunc = 9;
        }
        break;
      case 'T':
        puVar1 = (undefined1 *)((long)&local_288[-1]._vptr_memory_resource + 1);
        switch(puVar1) {
        case (undefined1 *)0x0:
          break;
        default:
          goto switchD_0022e561_caseD_1;
        case (undefined1 *)0x2:
switchD_0022e561_caseD_2:
          iVar4 = bcmp(__s1,"Transform",(size_t)pmVar7);
          if (iVar4 == 0) {
            local_2b8._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Token *)local_2b8);
            if ((undefined1)local_308[1] == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (((memory_resource *)local_328._0_8_ != (memory_resource *)0x1) ||
               (iVar4 = bcmp((void *)local_328._8_8_,"[",1), iVar4 != 0)) {
              if (local_260 == '\x01') {
                local_328._0_8_ = local_328 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_328,ppPStack_280,
                           (char *)((long)&local_288->_vptr_memory_resource + (long)ppPStack_280));
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)auStack_278,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
              }
LAB_00230c51:
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            lVar5 = 0;
            do {
              local_228._0_4_ = 1;
              if ((code *)local_248._16_8_ == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*(code *)local_248._24_8_)
                        ((Token *)local_2b8,(Token *)local_248,(Tokenizer *)local_228);
              if (local_290 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              dVar9 = parseNumber((Token *)local_2b8);
              *(float *)(local_328 + lVar5 * 4) = (float)dVar9;
              if (local_290 == '\x01') {
                local_290 = '\0';
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x10);
            local_228._0_4_ = 1;
            if ((code *)local_248._16_8_ == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*(code *)local_248._24_8_)
                      ((Token *)local_2b8,(Token *)local_248,(Tokenizer *)local_228);
            if (local_290 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (((memory_resource *)local_2b8._0_8_ != (memory_resource *)0x1) ||
               (iVar4 = bcmp((void *)local_2b8._8_8_,"]",1), iVar4 != 0)) {
              if (local_260 != '\0') {
                local_2b8._0_8_ = pmVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,ppPStack_280,
                           (char *)((long)&local_288->_vptr_memory_resource + (long)ppPStack_280));
                ErrorExit<std::__cxx11::string>
                          ((FileLoc *)auStack_278,"Unknown directive: %s",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b8);
              }
LAB_00230aa4:
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            if (local_260 != '\x01') goto LAB_00230aa4;
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*local_2c0->_vptr_SceneRepresentation[10])(local_2c0,local_328);
          }
          else {
            if (pmVar7 == (memory_resource *)0x7) break;
            if (pmVar7 == (memory_resource *)0xe) goto switchD_0022efdd_caseD_7;
            if ((pmVar7 != (memory_resource *)&DAT_00000009) ||
               (iVar4 = bcmp(__s1,"Translate",9), iVar4 != 0)) goto switchD_0022e561_caseD_1;
            lVar5 = 0;
            do {
              local_228._0_4_ = 1;
              if ((code *)local_248._16_8_ == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
              if ((undefined1)local_308[1] == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              dVar9 = parseNumber((Token *)local_328);
              *(float *)(local_2b8 + lVar5 * 4) = (float)dVar9;
              if ((undefined1)local_308[1] == '\x01') {
                local_308[1]._0_1_ = '\0';
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 3);
            if (local_260 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
            }
            in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
            in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
            (*local_2c0->_vptr_SceneRepresentation[6])
                      (local_2b8._0_8_ & 0xffffffff,(ulong)local_2b8._0_8_ >> 0x20,
                       local_2b8._8_8_ & 0xffffffff);
          }
          goto LAB_00230288;
        case (undefined1 *)0x5:
switchD_0022e561_caseD_5:
          iVar4 = bcmp(__s1,"TransformEnd",(size_t)pmVar7);
          if (iVar4 == 0) {
            lVar5 = 0xf8;
            goto LAB_0022ffe2;
          }
          if (pmVar7 != (memory_resource *)0x7) {
            if (pmVar7 == (memory_resource *)0xe) goto switchD_0022efdd_caseD_7;
            if (pmVar7 != (memory_resource *)&DAT_00000009) goto switchD_0022e561_caseD_1;
            goto switchD_0022e561_caseD_2;
          }
          break;
        case (undefined1 *)0x7:
          iVar4 = bcmp(ppPStack_280,"TransformBegin",(size_t)local_288);
          if (iVar4 == 0) {
            lVar5 = 0xf0;
            goto LAB_0022ffe2;
          }
          switch(puVar1) {
          case (undefined1 *)0x0:
            break;
          default:
            goto switchD_0022e561_caseD_1;
          case (undefined1 *)0x2:
            goto switchD_0022e561_caseD_2;
          case (undefined1 *)0x5:
            goto switchD_0022e561_caseD_5;
          case (undefined1 *)0x7:
switchD_0022efdd_caseD_7:
            iVar4 = bcmp(__s1,"TransformTimes",(size_t)pmVar7);
            if (iVar4 == 0) {
              lVar5 = 0;
              do {
                local_228._0_4_ = 1;
                if ((code *)local_248._16_8_ == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Tokenizer *)local_228);
                if ((undefined1)local_308[1] == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
                }
                dVar9 = parseNumber((Token *)local_328);
                *(float *)(local_2b8 + lVar5 * 4) = (float)dVar9;
                if ((undefined1)local_308[1] == '\x01') {
                  local_308[1]._0_1_ = '\0';
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 == 1);
              if (local_260 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
              }
              in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
              in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
              (*local_2c0->_vptr_SceneRepresentation[0x10])
                        (local_2b8._0_8_ & 0xffffffff,(ulong)local_2b8._0_8_ >> 0x20);
              goto LAB_00230288;
            }
            if (pmVar7 != (memory_resource *)0x7) goto switchD_0022e561_caseD_1;
          }
        }
        iVar4 = bcmp(__s1,"Texture",(size_t)pmVar7);
        if (iVar4 != 0) {
switchD_0022e561_caseD_1:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        local_2b8._0_4_ = 1;
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Token *)local_2b8);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        sVar10 = dequoteString((Token *)local_328);
        if ((undefined1)local_308[1] == '\x01') {
          local_308[1]._0_1_ = '\0';
        }
        local_228._0_8_ = local_218;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,sVar10._M_str,sVar10._M_str + sVar10._M_len);
        local_2b8._0_4_ = 1;
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)(local_328,(Token *)local_248,(Token *)local_2b8);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        sVar10 = dequoteString((Token *)local_328);
        if ((undefined1)local_308[1] == '\x01') {
          local_308[1]._0_1_ = '\0';
        }
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,sVar10._M_str,sVar10._M_str + sVar10._M_len);
        local_208[0]._0_4_ = 1;
        if ((code *)local_248._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)local_248._24_8_)(local_328,(Token *)local_248,local_208);
        if ((undefined1)local_308[1] == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        local_2b8._32_8_ = local_308[0];
        local_2b8._0_8_ = local_328._0_8_;
        local_2b8._8_8_ = local_328._8_8_;
        local_2b8._16_8_ = auStack_318._0_8_;
        local_2b8._24_8_ = auStack_318._8_8_;
        sVar10 = dequoteString((Token *)local_2b8);
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,sVar10._M_str,sVar10._M_str + sVar10._M_len);
        std::function<pstd::optional<pbrt::Token>_(int)>::function
                  ((function<pstd::optional<pbrt::Token>_(int)> *)&local_100,
                   (function<pstd::optional<pbrt::Token>_(int)> *)local_248);
        alloc_00.memoryResource._1_7_ = 0;
        alloc_00.memoryResource._0_1_ = local_329;
        _Stack_1b0._M_p = (pointer)0x0;
        local_1b8 = &local_249;
        pcStack_1a0 = std::
                      _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                      ::_M_invoke;
        pcStack_1a8 = std::
                      _Function_handler<void_(const_pbrt::Token_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:838:21)>
                      ::_M_manager;
        parseParameters<std::function<pstd::optional<pbrt::Token>(int)>,pbrt::parse(pbrt::SceneRepresentation*,std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>)::__5>
                  ((ParsedParameterVector *)local_328,(pbrt *)local_100._M_pod_data,
                   (function<pstd::optional<pbrt::Token>_(int)> *)local_1c8.ungetToken,
                   (anon_class_8_1_6da50f9a)local_1c0.memoryResource,alloc_00,SUB81(&local_1b8,0),
                   (function<void_(const_pbrt::Token_&,_const_char_*)> *)
                   CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        if (pcStack_1a8 != (code *)0x0) {
          (*pcStack_1a8)(&local_1b8,&local_1b8,3);
        }
        if (local_f0 != (code *)0x0) {
          (*local_f0)(&local_100,&local_100,__destroy_functor);
        }
        pSVar3 = local_2c0;
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                         *)(local_b0 + 0x20),
                        (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                         *)local_328);
        if (local_260 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
        }
        in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
        in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
        (*pSVar3->_vptr_SceneRepresentation[0x20])
                  (pSVar3,(Tokenizer *)local_228,local_1e8,local_208,
                   (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)(local_b0 + 0x20));
        local_38 = 0;
        (**(code **)(*(long *)local_b0._32_8_ + 0x18))
                  (local_b0._32_8_,local_b0._40_8_,local_40 << 3,8);
        local_2d0 = 0;
        (*(*(_func_int ***)local_328._0_8_)[3])(local_328._0_8_,local_328._8_8_,local_2d8 << 3,8);
        if ((_Invoker_type *)local_208[0] != local_1f8) {
          operator_delete((void *)local_208[0],(ulong)(local_1f8[0] + 1));
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        mVar6._vptr_memory_resource = local_218[0]._vptr_memory_resource;
        pmVar7 = (memory_resource *)local_228._0_8_;
        if ((memory_resource *)local_228._0_8_ != local_218) goto LAB_0022f753;
        goto LAB_00230288;
      case 'W':
        if (local_288 != (memory_resource *)0x8) {
          if ((local_288 != (memory_resource *)0xa) ||
             (iVar4 = bcmp(ppPStack_280,"WorldBegin",10), iVar4 != 0)) goto LAB_002304b9;
          lVar5 = 0xd0;
          goto LAB_0022ffe2;
        }
        iVar4 = bcmp(ppPStack_280,"WorldEnd",8);
        if ((iVar4 != 0) || (local_329 == false)) {
LAB_002304b9:
          local_328._0_8_ = local_328 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,__s1,
                     (char *)((long)&pmVar7->_vptr_memory_resource + (long)__s1));
          ErrorExit<std::__cxx11::string>
                    ((FileLoc *)auStack_278,"Unknown directive: %s",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328)
          ;
        }
        goto LAB_00230288;
      }
LAB_00230259:
      in_stack_fffffffffffffca8 = (int)auStack_278._0_8_;
      in_stack_fffffffffffffcac = SUB84(auStack_278._0_8_,4);
      loc.filename._M_str = (char *)auStack_278._8_8_;
      loc.filename._M_len = auStack_278._0_8_;
      loc.line = auStack_278._16_4_;
      loc.column = auStack_278._20_4_;
      parse::anon_class_48_6_0442aee5::operator()(&local_130,apiFunc,loc);
LAB_00230288:
      local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
    } while ((code *)local_248._16_8_ != (code *)0x0);
  }
  std::__throw_bad_function_call();
}

Assistant:

static void parse(SceneRepresentation *scene, std::unique_ptr<Tokenizer> t) {
    bool formatting = dynamic_cast<FormattingScene *>(scene) != nullptr;
    TrackedMemoryResource memoryResource;
    Allocator alloc(&memoryResource);

    std::vector<std::unique_ptr<Tokenizer>> fileStack;
    fileStack.push_back(std::move(t));

    pstd::optional<Token> ungetToken;

    auto parseError = [&](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };

    // nextToken is a little helper function that handles the file stack,
    // returning the next token from the current file until reaching EOF,
    // at which point it switches to the next file (if any).
    std::function<pstd::optional<Token>(int)> nextToken;
    nextToken = [&](int flags) -> pstd::optional<Token> {
        if (ungetToken.has_value())
            return std::exchange(ungetToken, {});

        if (fileStack.empty()) {
            if ((flags & TokenRequired) != 0) {
                ErrorExit("premature end of file");
            }
            return {};
        }

        pstd::optional<Token> tok = fileStack.back()->Next();

        if (!tok) {
            // We've reached EOF in the current file. Anything more to parse?
            fileStack.pop_back();
            return nextToken(flags);
        } else if (tok->token[0] == '#') {
            // Swallow comments, unless --format or --toply was given, in
            // which case they're printed to stdout.
            if (formatting)
                printf("%s%s\n", dynamic_cast<FormattingScene *>(scene)->indent().c_str(),
                       toString(tok->token).c_str());
            return nextToken(flags);
        } else
            // Regular token; success.
            return tok;
    };

    auto unget = [&](Token t) {
        CHECK(!ungetToken.has_value());
        ungetToken = t;
    };

    // Helper function for pbrt API entrypoints that take a single string
    // parameter and a ParameterVector (e.g. pbrtShape()).
    // using BasicEntrypoint = void (ParsedScene::*)(const std::string &,
    // ParsedParameterVector, FileLoc);
    auto basicParamListEntrypoint = [&](void (SceneRepresentation::*apiFunc)(
                                            const std::string &, ParsedParameterVector,
                                            FileLoc),
                                        FileLoc loc) {
        Token t = *nextToken(TokenRequired);
        std::string_view dequoted = dequoteString(t);
        std::string n = toString(dequoted);
        ParsedParameterVector parameterVector = parseParameters(
            nextToken, unget, alloc, formatting, [&](const Token &t, const char *msg) {
                std::string token = toString(t.token);
                std::string str = StringPrintf("%s: %s", token, msg);
                parseError(str.c_str(), &t.loc);
            });
        (scene->*apiFunc)(n, std::move(parameterVector), loc);
    };

    auto syntaxError = [&](const Token &t) {
        ErrorExit(&t.loc, "Unknown directive: %s", toString(t.token));
    };

    pstd::optional<Token> tok;
    CheckCallbackScope _([&tok]() -> std::string {
        if (!tok.has_value())
            return "";
        std::string filename(tok->loc.filename.begin(), tok->loc.filename.end());
        return StringPrintf("Current parser location %s:%d:%d", filename, tok->loc.line,
                            tok->loc.column);
    });

    while (true) {
        tok = nextToken(TokenOptional);
        if (!tok.has_value())
            break;

        switch (tok->token[0]) {
        case 'A':
            if (tok->token == "AttributeBegin")
                scene->AttributeBegin(tok->loc);
            else if (tok->token == "AttributeEnd")
                scene->AttributeEnd(tok->loc);
            else if (tok->token == "Attribute")
                basicParamListEntrypoint(&SceneRepresentation::Attribute, tok->loc);
            else if (tok->token == "ActiveTransform") {
                Token a = *nextToken(TokenRequired);
                if (a.token == "All")
                    scene->ActiveTransformAll(tok->loc);
                else if (a.token == "EndTime")
                    scene->ActiveTransformEndTime(tok->loc);
                else if (a.token == "StartTime")
                    scene->ActiveTransformStartTime(tok->loc);
                else
                    syntaxError(*tok);
            } else if (tok->token == "AreaLightSource")
                basicParamListEntrypoint(&SceneRepresentation::AreaLightSource, tok->loc);
            else if (tok->token == "Accelerator")
                basicParamListEntrypoint(&SceneRepresentation::Accelerator, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'C':
            if (tok->token == "ConcatTransform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->ConcatTransform(m, tok->loc);
            } else if (tok->token == "CoordinateSystem") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordinateSystem(toString(n), tok->loc);
            } else if (tok->token == "CoordSysTransform") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->CoordSysTransform(toString(n), tok->loc);
            } else if (tok->token == "ColorSpace") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ColorSpace(toString(n), tok->loc);
            } else if (tok->token == "Camera")
                basicParamListEntrypoint(&SceneRepresentation::Camera, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'F':
            if (tok->token == "Film")
                basicParamListEntrypoint(&SceneRepresentation::Film, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'I':
            if (tok->token == "Integrator")
                basicParamListEntrypoint(&SceneRepresentation::Integrator, tok->loc);
            else if (tok->token == "Include") {
                Token filenameToken = *nextToken(TokenRequired);
                std::string filename = toString(dequoteString(filenameToken));
                if (formatting)
                    Printf("%sInclude \"%s\"\n",
                           dynamic_cast<FormattingScene *>(scene)->indent(), filename);
                else {
                    filename = ResolveFilename(filename);
                    std::unique_ptr<Tokenizer> tinc =
                        Tokenizer::CreateFromFile(filename, parseError);
                    if (tinc)
                        fileStack.push_back(std::move(tinc));
                }
            } else if (tok->token == "Identity")
                scene->Identity(tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'L':
            if (tok->token == "LightSource")
                basicParamListEntrypoint(&SceneRepresentation::LightSource, tok->loc);
            else if (tok->token == "LookAt") {
                Float v[9];
                for (int i = 0; i < 9; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->LookAt(v[0], v[1], v[2], v[3], v[4], v[5], v[6], v[7], v[8],
                              tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'M':
            if (tok->token == "MakeNamedMaterial")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMaterial,
                                         tok->loc);
            else if (tok->token == "MakeNamedMedium")
                basicParamListEntrypoint(&SceneRepresentation::MakeNamedMedium, tok->loc);
            else if (tok->token == "Material")
                basicParamListEntrypoint(&SceneRepresentation::Material, tok->loc);
            else if (tok->token == "MediumInterface") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string names[2];
                names[0] = toString(n);

                // Check for optional second parameter
                pstd::optional<Token> second = nextToken(TokenOptional);
                if (second.has_value()) {
                    if (isQuotedString(second->token))
                        names[1] = toString(dequoteString(*second));
                    else {
                        unget(*second);
                        names[1] = names[0];
                    }
                } else
                    names[1] = names[0];

                scene->MediumInterface(names[0], names[1], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'N':
            if (tok->token == "NamedMaterial") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->NamedMaterial(toString(n), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'O':
            if (tok->token == "ObjectBegin") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectBegin(toString(n), tok->loc);
            } else if (tok->token == "ObjectEnd")
                scene->ObjectEnd(tok->loc);
            else if (tok->token == "ObjectInstance") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                scene->ObjectInstance(toString(n), tok->loc);
            } else if (tok->token == "Option") {
                std::string name = toString(dequoteString(*nextToken(TokenRequired)));
                std::string value = toString(nextToken(TokenRequired)->token);
                scene->Option(name, value, tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'P':
            if (tok->token == "PixelFilter")
                basicParamListEntrypoint(&SceneRepresentation::PixelFilter, tok->loc);
            else
                syntaxError(*tok);
            break;

        case 'R':
            if (tok->token == "ReverseOrientation")
                scene->ReverseOrientation(tok->loc);
            else if (tok->token == "Rotate") {
                Float v[4];
                for (int i = 0; i < 4; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Rotate(v[0], v[1], v[2], v[3], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'S':
            if (tok->token == "Shape")
                basicParamListEntrypoint(&SceneRepresentation::Shape, tok->loc);
            else if (tok->token == "Sampler")
                basicParamListEntrypoint(&SceneRepresentation::Sampler, tok->loc);
            else if (tok->token == "Scale") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Scale(v[0], v[1], v[2], tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'T':
            if (tok->token == "TransformBegin")
                scene->TransformBegin(tok->loc);
            else if (tok->token == "TransformEnd")
                scene->TransformEnd(tok->loc);
            else if (tok->token == "Transform") {
                if (nextToken(TokenRequired)->token != "[")
                    syntaxError(*tok);
                Float m[16];
                for (int i = 0; i < 16; ++i)
                    m[i] = parseNumber(*nextToken(TokenRequired));
                if (nextToken(TokenRequired)->token != "]")
                    syntaxError(*tok);
                scene->Transform(m, tok->loc);
            } else if (tok->token == "Translate") {
                Float v[3];
                for (int i = 0; i < 3; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->Translate(v[0], v[1], v[2], tok->loc);
            } else if (tok->token == "TransformTimes") {
                Float v[2];
                for (int i = 0; i < 2; ++i)
                    v[i] = parseNumber(*nextToken(TokenRequired));
                scene->TransformTimes(v[0], v[1], tok->loc);
            } else if (tok->token == "Texture") {
                std::string_view n = dequoteString(*nextToken(TokenRequired));
                std::string name = toString(n);
                n = dequoteString(*nextToken(TokenRequired));
                std::string type = toString(n);

                Token t = *nextToken(TokenRequired);
                std::string_view dequoted = dequoteString(t);
                std::string texName = toString(dequoted);
                ParsedParameterVector params = parseParameters(
                    nextToken, unget, alloc, formatting,
                    [&](const Token &t, const char *msg) {
                        std::string token = toString(t.token);
                        std::string str = StringPrintf("%s: %s", token, msg);
                        parseError(str.c_str(), &t.loc);
                    });

                scene->Texture(name, type, texName, std::move(params), tok->loc);
            } else
                syntaxError(*tok);
            break;

        case 'W':
            if (tok->token == "WorldBegin")
                scene->WorldBegin(tok->loc);
            else if (tok->token == "WorldEnd" && formatting)
                ;  // just swallow it
            else
                syntaxError(*tok);
            break;

        default:
            syntaxError(*tok);
        }
    }
}